

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O2

void glcts::fillImage<float,1u>
               (GLsizei image_width,GLsizei image_height,float *pixel_components,float *out_data)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  
  uVar2 = 0;
  uVar3 = 0;
  if (0 < image_width) {
    uVar3 = (ulong)(uint)image_width;
  }
  if (image_height < 1) {
    image_height = 0;
  }
  for (iVar4 = 0; uVar5 = uVar3, uVar1 = uVar2, iVar4 != image_height; iVar4 = iVar4 + 1) {
    while( true ) {
      if (uVar5 == 0) break;
      out_data[uVar1] = *pixel_components;
      uVar5 = uVar5 - 1;
      uVar1 = uVar1 + 1;
    }
    uVar2 = uVar2 + image_width;
  }
  return;
}

Assistant:

void fillImage(glw::GLsizei image_width, glw::GLsizei image_height, const T* pixel_components, T* out_data)
{
	const glw::GLuint n_components_per_pixel = N_Components;
	const glw::GLuint n_components_per_line  = n_components_per_pixel * image_width;

	for (glw::GLsizei y = 0; y < image_height; ++y)
	{
		const glw::GLuint line_offset = y * n_components_per_line;

		for (glw::GLsizei x = 0; x < image_width; ++x)
		{
			for (glw::GLuint component = 0; component < n_components_per_pixel; ++component)
			{
				out_data[line_offset + x * n_components_per_pixel + component] = pixel_components[component];
			}
		}
	}
}